

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessFinished
          (BuildSystemFrontendDelegate *this,Command *param_1,ProcessHandle handle,
          ProcessResult *result)

{
  void *pvVar1;
  pointer __ptr;
  pointer pvVar2;
  iterator I;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  uint64_t local_28;
  
  pvVar1 = this->impl;
  local_38._M_device = (mutex_type *)((long)pvVar1 + 0x50);
  local_38._M_owns = false;
  local_28 = handle.id;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  I = llvm::
      DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)((long)pvVar1 + 0x38),&local_28);
  pvVar2 = I.Ptr;
  if (pvVar2 != (pointer)((ulong)*(uint *)((long)pvVar1 + 0x48) * 0x20 +
                         *(long *)((long)pvVar1 + 0x38))) {
    __ptr = (pvVar2->
            super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
            second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    fwrite(__ptr,(long)(pvVar2->
                       super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ).second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)__ptr,1,_stdout);
    fflush(_stdout);
    llvm::
    DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::erase((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)((long)pvVar1 + 0x38),I);
  }
  if (local_38._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_38);
  }
  return;
}

Assistant:

void BuildSystemFrontendDelegate::
commandProcessFinished(Command*, ProcessHandle handle,
                       const ProcessResult& result) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  std::unique_lock<std::mutex> lock(impl->processOutputBuffersMutex);

  // If there was an output buffer, flush it.
  auto it = impl->processOutputBuffers.find(handle.id);
  if (it == impl->processOutputBuffers.end())
    return;

  fwrite(it->second.data(), it->second.size(), 1, stdout);
  fflush(stdout);

  impl->processOutputBuffers.erase(it);  
}